

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool ON_ModelComponent::IsValidComponentName
               (ON_ComponentManifest *model_manfest,ON_ModelComponent *model_component,
               bool bPermitReferencePrefix,ON_wString *valid_name)

{
  Type TVar1;
  uchar auVar2 [8];
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ON__UINT64 OVar6;
  wchar_t *pwVar7;
  wchar_t *base_name;
  byte bVar8;
  uint uVar9;
  ON_wString *pOVar10;
  undefined8 unaff_R13;
  ON_ComponentManifestItem *pOVar11;
  ON_UUID OVar12;
  ON_UUID component_parent_id;
  ON_wString ref;
  ON_wString leaf;
  ON_wString original_name;
  ON_wString parent;
  uint in_stack_ffffffffffffff7c;
  ON_ComponentManifest local_70;
  ON_wString local_68;
  ON_ComponentManifest *local_60;
  ON_wString local_58;
  ON_wString *local_50;
  ON_ComponentManifest local_48;
  ON_wString local_40;
  ulong local_38;
  
  local_60 = model_manfest;
  ON_wString::operator=(valid_name,&ON_wString::EmptyString);
  local_38 = CONCAT71((int7)((ulong)unaff_R13 >> 8),model_component->m_component_type);
  pOVar10 = &model_component->m_component_name;
  if ((model_component->m_set_status & 0x20) == 0) {
    pOVar10 = &ON_wString::EmptyString;
  }
  ON_wString::ON_wString(&local_58,pOVar10);
  bVar3 = IsValidComponentName(&local_58);
  local_50 = valid_name;
  if (!bVar3) {
    bVar3 = false;
    goto LAB_0053bb3d;
  }
  uVar9 = (int)local_38 - 1;
  bVar8 = (byte)uVar9;
  if ((bVar8 < 0x11) && ((0x17fffU >> (uVar9 & 0x1f) & 1) != 0)) {
    bVar8 = (byte)(0x3907 >> (bVar8 & 0x1f));
  }
  else {
    bVar8 = 1;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x807,"","Invalid component_type parameter.");
  }
  bVar3 = true;
  if ((bVar8 & bPermitReferencePrefix) != 0) goto LAB_0053bb3d;
  if ((bVar8 & 1) == 0) {
    pOVar11 = ON_ComponentManifest::ItemFromName(local_60,model_component);
  }
  else {
    pOVar11 = &ON_ComponentManifestItem::UnsetItem;
  }
  OVar6 = ON_ComponentManifestItem::ComponentRuntimeSerialNumber(pOVar11);
  bVar3 = true;
  bVar5 = true;
  if (OVar6 != model_component->m_runtime_serial_number) {
    bVar4 = ON_ComponentManifestItem::IsUnset(pOVar11);
    bVar5 = true;
    if (!bVar4) {
      bVar5 = ON_ComponentManifestItem::IsSystemComponent(pOVar11);
    }
  }
  if ((bVar5 & bPermitReferencePrefix) != 0) goto LAB_0053bb3d;
  ON_wString::ON_wString((ON_wString *)&local_70);
  ON_wString::ON_wString(&local_40);
  ON_wString::ON_wString(&local_68);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_58);
  SplitName(pwVar7,(ON_wString *)&local_70,&local_40,&local_68);
  if (bVar5 == false) {
LAB_0053ba44:
    bVar3 = IsValidComponentName(&local_68);
    pOVar10 = local_50;
    if (bVar3) {
      if ((bVar8 & 1) == 0) {
        OVar12 = model_component->m_component_parent_id;
        pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_68);
        pOVar11 = ON_ComponentManifest::ItemFromName(local_60,(Type)local_38,OVar12,pwVar7);
      }
      else {
        pOVar11 = &ON_ComponentManifestItem::UnsetItem;
      }
      bVar3 = ON_ComponentManifestItem::IsUnset(pOVar11);
      if (!bVar3) {
        bVar3 = ON_ComponentManifestItem::IsSystemComponent(pOVar11);
        if (!bVar3) {
          TVar1 = model_component->m_component_type;
          auVar2 = *(uchar (*) [8])&model_component->m_component_parent_id;
          pwVar7 = *(wchar_t **)(model_component->m_component_parent_id).Data4;
          base_name = ON_wString::operator_cast_to_wchar_t_(&local_68);
          OVar12._1_7_ = 0;
          OVar12.Data1._0_1_ = TVar1;
          OVar12.Data4 = auVar2;
          ON_ComponentManifest::UnusedName
                    (&local_48,(Type)local_60,OVar12,pwVar7,base_name,(wchar_t *)0x0,0,
                     (uint *)((ulong)in_stack_ffffffffffffff7c << 0x20));
          ON_wString::operator=(pOVar10,(ON_wString *)&local_48);
          ON_wString::~ON_wString((ON_wString *)&local_48);
          goto LAB_0053bb1d;
        }
      }
      ON_wString::operator=(pOVar10,&local_68);
    }
LAB_0053bb1d:
    bVar3 = false;
  }
  else {
    bVar5 = ON_wString::IsEmpty((ON_wString *)&local_70);
    bVar3 = true;
    if (!bVar5) goto LAB_0053ba44;
  }
  ON_wString::~ON_wString(&local_68);
  ON_wString::~ON_wString(&local_40);
  ON_wString::~ON_wString((ON_wString *)&local_70);
LAB_0053bb3d:
  pOVar10 = local_50;
  if (bVar3 == false) {
    bVar5 = ON_wString::IsEmpty(local_50);
    if (bVar5) {
      component_parent_id._0_8_ = local_38 & 0xff;
      component_parent_id.Data4 = *(uchar (*) [8])&model_component->m_component_parent_id;
      ON_ComponentManifest::UnusedName
                (&local_70,(Type)local_60,component_parent_id,
                 *(wchar_t **)(model_component->m_component_parent_id).Data4,(wchar_t *)0x0,
                 (wchar_t *)0x0,0,(uint *)((ulong)in_stack_ffffffffffffff7c << 0x20));
      ON_wString::operator=(pOVar10,(ON_wString *)&local_70);
      ON_wString::~ON_wString((ON_wString *)&local_70);
    }
  }
  else {
    ON_wString::operator=(local_50,&local_58);
  }
  ON_wString::~ON_wString(&local_58);
  return bVar3;
}

Assistant:

bool ON_ModelComponent::IsValidComponentName(
  const class ON_ComponentManifest&  model_manfest,
  const ON_ModelComponent& model_component,
  bool bPermitReferencePrefix,
  ON_wString& valid_name
)
{
  valid_name = ON_wString::EmptyString;
  const ON_ModelComponent::Type model_component_type = model_component.ComponentType();

  const ON_wString original_name = model_component.Name();

  bool rc = false;
  for (;;)
  {
    if (false == ON_ModelComponent::IsValidComponentName(original_name))
    {
      break;
    }

    const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(model_component_type);
    if (bPermitReferencePrefix && false == bUniqueNameRequired)
    {
      rc = true;
      break;
    }

    const class ON_ComponentManifestItem& item
      = (bUniqueNameRequired)
      ? model_manfest.ItemFromName(&model_component)
      : ON_ComponentManifestItem::UnsetItem;

    const bool bItemFromNameIsOK
      =  (item.ComponentRuntimeSerialNumber() == model_component.RuntimeSerialNumber())
      || item.IsUnset()
      || item.IsSystemComponent()
      ;

    if ( bItemFromNameIsOK && bPermitReferencePrefix)
    {
      rc = true;
      break;
    }

    ON_wString ref;
    ON_wString parent;
    ON_wString leaf;
    ON_ModelComponent::SplitName(
      original_name,
      ref,
      parent,
      leaf
    );
    if (bItemFromNameIsOK && ref.IsEmpty())
    {
      rc = true;
      break;
    }

    if (false == ON_ModelComponent::IsValidComponentName(leaf))
      break;

    const class ON_ComponentManifestItem& leaf_item
      = (bUniqueNameRequired)
      ? model_manfest.ItemFromName(model_component_type,model_component.ParentId(),leaf)
      : ON_ComponentManifestItem::UnsetItem;

    if (leaf_item.IsUnset() || leaf_item.IsSystemComponent())
    {
      valid_name = leaf;
      break;
    }

    valid_name = model_manfest.UnusedName(
      model_component.ComponentType(),
      model_component.ParentId(),
      leaf,
      nullptr,
      nullptr,
      0,
      nullptr
    );

    break;
  }

  if (rc)
  {
    valid_name = original_name;
  }
  else if (valid_name.IsEmpty())
  {
    valid_name = model_manfest.UnusedName(
      model_component_type,
      model_component.ParentId(),
      nullptr,
      nullptr,
      nullptr,
      0,
      nullptr
    );
  }

  return rc;
}